

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renameQuotefixFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  sqlite3_xauth p_Var1;
  Select *p;
  int iVar2;
  sqlite3 *db_00;
  uchar *zDb_00;
  uchar *zSql;
  Expr *pExpr;
  int local_248;
  int local_244;
  int i;
  Select *pSelect;
  Walker sWalker;
  RenameCtx sCtx;
  Parse sParse;
  int rc;
  sqlite3_xauth xAuth;
  char *zInput;
  char *zDb;
  sqlite3 *db;
  sqlite3_value **argv_local;
  int NotUsed_local;
  sqlite3_context *context_local;
  
  db_00 = sqlite3_context_db_handle(context);
  zDb_00 = sqlite3_value_text(*argv);
  zSql = sqlite3_value_text(argv[1]);
  p_Var1 = db_00->xAuth;
  db_00->xAuth = (sqlite3_xauth)0x0;
  sqlite3BtreeEnterAll(db_00);
  if ((zDb_00 != (uchar *)0x0) && (zSql != (uchar *)0x0)) {
    sParse.pRename._4_4_ = renameParseSql((Parse *)&sCtx.zOld,(char *)zDb_00,db_00,(char *)zSql,0);
    if (sParse.pRename._4_4_ == 0) {
      memset(&sWalker.u,0,0x20);
      memset(&pSelect,0,0x30);
      pSelect = (Select *)&sCtx.zOld;
      sWalker.pParse = (Parse *)renameQuotefixExprCb;
      sWalker.xExprCallback = renameColumnSelectCb;
      sWalker._32_8_ = &sWalker.u;
      if (sParse.zTail == (char *)0x0) {
        if (sParse.pNewTable == (Table *)0x0) {
          sParse.pRename._4_4_ = renameResolveTrigger((Parse *)&sCtx.zOld);
          if (sParse.pRename._4_4_ == 0) {
            renameWalkTrigger((Walker *)&pSelect,(Trigger *)sParse.pNewIndex);
          }
        }
        else {
          sqlite3WalkExprList((Walker *)&pSelect,((sParse.pNewTable)->u).tab.pDfltList);
          sqlite3WalkExpr((Walker *)&pSelect,(Expr *)((sParse.pNewTable)->u).tab.pFKey);
        }
      }
      else if (sParse.zTail[0x3f] == '\x02') {
        p = *(Select **)(sParse.zTail + 0x40);
        p->selFlags = p->selFlags & 0xffdfffff;
        sqlite3SelectPrep((Parse *)&sCtx.zOld,p,(NameContext *)0x0);
        if (db_00->mallocFailed == '\0') {
          local_248 = 0;
        }
        else {
          local_248 = 7;
        }
        sParse.pRename._4_4_ = local_248;
        if (local_248 == 0) {
          sqlite3WalkSelect((Walker *)&pSelect,p);
        }
      }
      else {
        sqlite3WalkExprList((Walker *)&pSelect,*(ExprList **)(sParse.zTail + 0x20));
        for (local_244 = 0; local_244 < *(short *)(sParse.zTail + 0x36); local_244 = local_244 + 1)
        {
          pExpr = sqlite3ColumnExpr((Table *)sParse.zTail,
                                    (Column *)(*(long *)(sParse.zTail + 8) + (long)local_244 * 0x10)
                                   );
          sqlite3WalkExpr((Walker *)&pSelect,pExpr);
        }
      }
      if (sParse.pRename._4_4_ == 0) {
        sParse.pRename._4_4_ =
             renameEditSql(context,(RenameCtx *)&sWalker.u,(char *)zSql,(char *)0x0,0);
      }
      renameTokenFree(db_00,(RenameToken *)sWalker.u.pNC);
    }
    if (sParse.pRename._4_4_ != 0) {
      iVar2 = sqlite3WritableSchema(db_00);
      if ((iVar2 == 0) || (sParse.pRename._4_4_ != 1)) {
        sqlite3_result_error_code(context,sParse.pRename._4_4_);
      }
      else {
        sqlite3_result_value(context,argv[1]);
      }
    }
    renameParseCleanup((Parse *)&sCtx.zOld);
  }
  db_00->xAuth = p_Var1;
  sqlite3BtreeLeaveAll(db_00);
  return;
}

Assistant:

static void renameQuotefixFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  char const *zDb = (const char*)sqlite3_value_text(argv[0]);
  char const *zInput = (const char*)sqlite3_value_text(argv[1]);

#ifndef SQLITE_OMIT_AUTHORIZATION
  sqlite3_xauth xAuth = db->xAuth;
  db->xAuth = 0;
#endif

  sqlite3BtreeEnterAll(db);

  UNUSED_PARAMETER(NotUsed);
  if( zDb && zInput ){
    int rc;
    Parse sParse;
    rc = renameParseSql(&sParse, zDb, db, zInput, 0);

    if( rc==SQLITE_OK ){
      RenameCtx sCtx;
      Walker sWalker;

      /* Walker to find tokens that need to be replaced. */
      memset(&sCtx, 0, sizeof(RenameCtx));
      memset(&sWalker, 0, sizeof(Walker));
      sWalker.pParse = &sParse;
      sWalker.xExprCallback = renameQuotefixExprCb;
      sWalker.xSelectCallback = renameColumnSelectCb;
      sWalker.u.pRename = &sCtx;

      if( sParse.pNewTable ){
        if( IsView(sParse.pNewTable) ){
          Select *pSelect = sParse.pNewTable->u.view.pSelect;
          pSelect->selFlags &= ~SF_View;
          sParse.rc = SQLITE_OK;
          sqlite3SelectPrep(&sParse, pSelect, 0);
          rc = (db->mallocFailed ? SQLITE_NOMEM : sParse.rc);
          if( rc==SQLITE_OK ){
            sqlite3WalkSelect(&sWalker, pSelect);
          }
        }else{
          int i;
          sqlite3WalkExprList(&sWalker, sParse.pNewTable->pCheck);
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
          for(i=0; i<sParse.pNewTable->nCol; i++){
            sqlite3WalkExpr(&sWalker,
               sqlite3ColumnExpr(sParse.pNewTable,
                                         &sParse.pNewTable->aCol[i]));
          }
#endif /* SQLITE_OMIT_GENERATED_COLUMNS */
        }
      }else if( sParse.pNewIndex ){
        sqlite3WalkExprList(&sWalker, sParse.pNewIndex->aColExpr);
        sqlite3WalkExpr(&sWalker, sParse.pNewIndex->pPartIdxWhere);
      }else{
#ifndef SQLITE_OMIT_TRIGGER
        rc = renameResolveTrigger(&sParse);
        if( rc==SQLITE_OK ){
          renameWalkTrigger(&sWalker, sParse.pNewTrigger);
        }
#endif /* SQLITE_OMIT_TRIGGER */
      }

      if( rc==SQLITE_OK ){
        rc = renameEditSql(context, &sCtx, zInput, 0, 0);
      }
      renameTokenFree(db, sCtx.pList);
    }
    if( rc!=SQLITE_OK ){
      if( sqlite3WritableSchema(db) && rc==SQLITE_ERROR ){
        sqlite3_result_value(context, argv[1]);
      }else{
        sqlite3_result_error_code(context, rc);
      }
    }
    renameParseCleanup(&sParse);
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  db->xAuth = xAuth;
#endif

  sqlite3BtreeLeaveAll(db);
}